

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_build_16bit_table
               (png_structrp png_ptr,png_uint_16pp *ptable,uint shift,png_fixed_point gamma_val)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  png_uint_16pp pppVar4;
  png_uint_16 *ppVar5;
  double dVar6;
  uint local_68;
  uint local_64;
  png_uint_32 ig_1;
  uint j_1;
  double d;
  png_uint_32 ig;
  uint j;
  png_uint_16p sub_table;
  png_uint_16pp table;
  uint i;
  uint max_by_2;
  uint max;
  double fmax;
  uint num;
  png_fixed_point gamma_val_local;
  uint shift_local;
  png_uint_16pp *ptable_local;
  png_structrp png_ptr_local;
  
  cVar1 = (char)shift;
  uVar2 = 1 << (8U - cVar1 & 0x1f);
  pppVar4 = (png_uint_16pp)png_calloc(png_ptr,(ulong)uVar2 << 3);
  *ptable = pppVar4;
  for (table._4_4_ = 0; table._4_4_ < uVar2; table._4_4_ = table._4_4_ + 1) {
    ppVar5 = (png_uint_16 *)png_malloc(png_ptr,0x200);
    pppVar4[table._4_4_] = ppVar5;
    iVar3 = png_gamma_significant(gamma_val);
    if (iVar3 == 0) {
      for (local_64 = 0; local_64 < 0x100; local_64 = local_64 + 1) {
        local_68 = (local_64 << (8U - cVar1 & 0x1f)) + table._4_4_;
        if (shift != 0) {
          local_68 = (local_68 * 0xffff + (1 << (0xfU - cVar1 & 0x1f))) /
                     ((1 << (0x10U - cVar1 & 0x1f)) - 1U);
        }
        ppVar5[local_64] = (png_uint_16)local_68;
      }
    }
    else {
      for (d._4_4_ = 0; d._4_4_ < 0x100; d._4_4_ = d._4_4_ + 1) {
        dVar6 = pow((double)((d._4_4_ << (8U - cVar1 & 0x1f)) + table._4_4_) *
                    (1.0 / (double)((1 << (0x10U - cVar1 & 0x1f)) + -1)),(double)gamma_val * 1e-05);
        dVar6 = floor(dVar6 * 65535.0 + 0.5);
        ppVar5[d._4_4_] = (png_uint_16)(int)dVar6;
      }
    }
  }
  return;
}

Assistant:

static void
png_build_16bit_table(png_structrp png_ptr, png_uint_16pp *ptable,
    unsigned int shift, png_fixed_point gamma_val)
{
   /* Various values derived from 'shift': */
   unsigned int num = 1U << (8U - shift);
#ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
   /* CSE the division and work round wacky GCC warnings (see the comments
    * in png_gamma_8bit_correct for where these come from.)
    */
   double fmax = 1.0 / (((png_int_32)1 << (16U - shift)) - 1);
#endif
   unsigned int max = (1U << (16U - shift)) - 1U;
   unsigned int max_by_2 = 1U << (15U - shift);
   unsigned int i;

   png_uint_16pp table = *ptable =
       (png_uint_16pp)png_calloc(png_ptr, num * (sizeof (png_uint_16p)));

   for (i = 0; i < num; i++)
   {
      png_uint_16p sub_table = table[i] =
          (png_uint_16p)png_malloc(png_ptr, 256 * (sizeof (png_uint_16)));

      /* The 'threshold' test is repeated here because it can arise for one of
       * the 16-bit tables even if the others don't hit it.
       */
      if (png_gamma_significant(gamma_val) != 0)
      {
         /* The old code would overflow at the end and this would cause the
          * 'pow' function to return a result >1, resulting in an
          * arithmetic error.  This code follows the spec exactly; ig is
          * the recovered input sample, it always has 8-16 bits.
          *
          * We want input * 65535/max, rounded, the arithmetic fits in 32
          * bits (unsigned) so long as max <= 32767.
          */
         unsigned int j;
         for (j = 0; j < 256; j++)
         {
            png_uint_32 ig = (j << (8-shift)) + i;
#           ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
               /* Inline the 'max' scaling operation: */
               /* See png_gamma_8bit_correct for why the cast to (int) is
                * required here.
                */
               double d = floor(65535.*pow(ig*fmax, gamma_val*.00001)+.5);
               sub_table[j] = (png_uint_16)d;
#           else
               if (shift != 0)
                  ig = (ig * 65535U + max_by_2)/max;

               sub_table[j] = png_gamma_16bit_correct(ig, gamma_val);
#           endif
         }
      }
      else
      {
         /* We must still build a table, but do it the fast way. */
         unsigned int j;

         for (j = 0; j < 256; j++)
         {
            png_uint_32 ig = (j << (8-shift)) + i;

            if (shift != 0)
               ig = (ig * 65535U + max_by_2)/max;

            sub_table[j] = (png_uint_16)ig;
         }
      }
   }
}